

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_segment_suite.cpp
# Opt level: O2

void api_suite::api_data_const(void)

{
  reference piVar1;
  const_segment cVar2;
  initializer_list<int> input;
  initializer_list<int> input_00;
  const_iterator local_98;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  circular_view<int,_18446744073709551615UL> original;
  
  span.member.data = array;
  original.member.cap = 4;
  original.member.size = 0;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  original.member.next = 4;
  span.member.size = 0;
  span.member.next = 4;
  span.member.cap = 4;
  original.member.data = span.member.data;
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::first_segment(&span);
  boost::detail::test_impl
            ("first.data() == nullptr",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x46,"void api_suite::api_data_const()",cVar2.member.head == (pointer)0x0);
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::first_segment(&span);
  boost::detail::test_impl
            ("cfirst.data() == nullptr",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x48,"void api_suite::api_data_const()",cVar2.member.head == (pointer)0x0);
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::last_segment(&span);
  boost::detail::test_impl
            ("last.data() == nullptr",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x4a,"void api_suite::api_data_const()",cVar2.member.head == (pointer)0x0);
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::last_segment(&span);
  boost::detail::test_impl
            ("clast.data() == nullptr",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x4c,"void api_suite::api_data_const()",cVar2.member.head == (pointer)0x0);
  span.member.data = (pointer)CONCAT44(span.member.data._4_4_,0xb);
  input._M_len = 1;
  input._M_array = (iterator)&span;
  vista::circular_view<int,_18446744073709551615UL>::assign(&original,input);
  span.member.size = original.member.size;
  span.member.next = original.member.next;
  span.member.data = original.member.data;
  span.member.cap = original.member.cap;
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::first_segment(&span);
  local_98 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     (&local_98);
  boost::detail::test_impl
            ("first.data() == &*span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x52,"void api_suite::api_data_const()",cVar2.member.head == piVar1);
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::first_segment(&span);
  local_98 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     (&local_98);
  boost::detail::test_impl
            ("cfirst.data() == &*span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x54,"void api_suite::api_data_const()",cVar2.member.head == piVar1);
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::last_segment(&span);
  local_98 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     (&local_98);
  boost::detail::test_impl
            ("last.data() != &*span.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x56,"void api_suite::api_data_const()",cVar2.member.head != piVar1);
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::last_segment(&span);
  local_98 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     (&local_98);
  boost::detail::test_impl
            ("clast.data() != &*span.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x58,"void api_suite::api_data_const()",cVar2.member.head != piVar1);
  span.member.data = (pointer)0x160000000b;
  span.member.cap = 0x2c00000021;
  span.member.size = CONCAT44(span.member.size._4_4_,0x37);
  input_00._M_len = 5;
  input_00._M_array = (iterator)&span;
  vista::circular_view<int,_18446744073709551615UL>::assign(&original,input_00);
  span.member.size = original.member.size;
  span.member.next = original.member.next;
  span.member.data = original.member.data;
  span.member.cap = original.member.cap;
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::first_segment(&span);
  local_98 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     (&local_98);
  boost::detail::test_impl
            ("first.data() == &*span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x60,"void api_suite::api_data_const()",cVar2.member.head == piVar1);
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::first_segment(&span);
  local_98 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     (&local_98);
  boost::detail::test_impl
            ("cfirst.data() == &*span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x62,"void api_suite::api_data_const()",cVar2.member.head == piVar1);
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::last_segment(&span);
  local_98 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     (&local_98);
  boost::detail::test_impl
            ("last.data() != &*span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,100,"void api_suite::api_data_const()",cVar2.member.head != piVar1);
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::last_segment(&span);
  local_98 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     (&local_98);
  boost::detail::test_impl
            ("clast.data() != &*span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x66,"void api_suite::api_data_const()",cVar2.member.head != piVar1);
  return;
}

Assistant:

void api_data_const()
{
    int array[4] = {};
    circular_view<int> original(array);
    {
        const circular_view<int> span(original);
        auto first = span.first_segment();
        BOOST_TEST(first.data() == nullptr);
        const auto cfirst = span.first_segment();
        BOOST_TEST(cfirst.data() == nullptr);
        auto last = span.last_segment();
        BOOST_TEST(last.data() == nullptr);
        const auto clast = span.last_segment();
        BOOST_TEST(clast.data() == nullptr);
    }
    original = { 11 };
    {
        const circular_view<int> span(original);
        auto first = span.first_segment();
        BOOST_TEST(first.data() == &*span.begin());
        const auto cfirst = span.first_segment();
        BOOST_TEST(cfirst.data() == &*span.begin());
        auto last = span.last_segment();
        BOOST_TEST(last.data() != &*span.end());
        const auto clast = span.last_segment();
        BOOST_TEST(clast.data() != &*span.end());
    }
    // 55 22 33 44
    // -> <-------
    original = { 11, 22, 33, 44, 55 };
    {
        const circular_view<int> span(original);
        auto first = span.first_segment();
        BOOST_TEST(first.data() == &*span.begin());
        const auto cfirst = span.first_segment();
        BOOST_TEST(cfirst.data() == &*span.begin());
        auto last = span.last_segment();
        BOOST_TEST(last.data() != &*span.begin());
        const auto clast = span.last_segment();
        BOOST_TEST(clast.data() != &*span.begin());
    }
}